

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

char * __thiscall btSoftBody::serialize(btSoftBody *this,void *dataBuffer,btSerializer *serializer)

{
  btScalar bVar1;
  uint uVar2;
  Material *pMVar3;
  long lVar4;
  Anchor *pAVar5;
  Cluster **ppCVar6;
  Cluster *pCVar7;
  Joint **ppJVar8;
  btScalar bVar9;
  btSerializer *pbVar10;
  tNodeArray *ptVar11;
  int iVar12;
  undefined4 uVar13;
  float fVar14;
  int iVar15;
  long lVar16;
  undefined8 uVar17;
  long lVar18;
  void *pvVar19;
  btDbvtNode *pbVar20;
  Joint *pJVar21;
  Node *pNVar22;
  ulong uVar23;
  Face *pFVar24;
  Tetra *pTVar25;
  Link *pLVar26;
  Pose *pPVar27;
  btMatrix3x3FloatData *pbVar28;
  float *pfVar29;
  int *piVar30;
  tNodeArray *ptVar31;
  undefined8 *puVar32;
  ulong uVar33;
  ulong uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int i;
  void *local_f8;
  btSerializer *local_f0;
  Pose *local_e8;
  tNodeArray *local_e0;
  int *local_d8;
  anon_union_8_2_511b660c_for_btHashPtr_0 local_d0;
  long local_c8;
  Pose *local_c0;
  long local_b8;
  btHashMap<btHashPtr,_int> m_nodeIndexMap;
  
  btCollisionObject::serialize(&this->super_btCollisionObject,dataBuffer,serializer);
  m_nodeIndexMap.m_hashTable.m_ownsMemory = true;
  m_nodeIndexMap.m_hashTable.m_data = (int *)0x0;
  m_nodeIndexMap.m_hashTable.m_size = 0;
  m_nodeIndexMap.m_hashTable.m_capacity = 0;
  m_nodeIndexMap.m_next.m_ownsMemory = true;
  m_nodeIndexMap.m_next.m_data = (int *)0x0;
  m_nodeIndexMap.m_next.m_size = 0;
  m_nodeIndexMap.m_next.m_capacity = 0;
  m_nodeIndexMap.m_valueArray.m_ownsMemory = true;
  m_nodeIndexMap.m_valueArray.m_data = (int *)0x0;
  m_nodeIndexMap.m_valueArray.m_size = 0;
  m_nodeIndexMap.m_valueArray.m_capacity = 0;
  m_nodeIndexMap.m_keyArray.m_ownsMemory = true;
  m_nodeIndexMap.m_keyArray.m_data = (btHashPtr *)0x0;
  m_nodeIndexMap.m_keyArray.m_size = 0;
  m_nodeIndexMap.m_keyArray.m_capacity = 0;
  iVar15 = (this->m_materials).m_size;
  *(int *)((long)dataBuffer + 0x158) = iVar15;
  local_f8 = dataBuffer;
  local_f0 = serializer;
  if (iVar15 == 0) {
    *(undefined8 *)((long)dataBuffer + 0x118) = 0;
  }
  else {
    lVar16 = (**(code **)(*(long *)serializer + 0x38))(serializer,&this->m_materials);
    *(long *)((long)local_f8 + 0x118) = lVar16;
    if (lVar16 != 0) {
      uVar2 = *(uint *)((long)local_f8 + 0x158);
      local_e0 = (tNodeArray *)&this->m_materials;
      local_e8 = (Pose *)(**(code **)(*(long *)serializer + 0x20))(serializer,8,uVar2);
      pbVar10 = local_f0;
      uVar23 = 0;
      uVar34 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar34 = uVar23;
      }
      lVar16 = *(long *)&local_e8->m_pos;
      for (; serializer = local_f0, uVar34 != uVar23; uVar23 = uVar23 + 1) {
        pMVar3 = (this->m_materials).m_data[uVar23];
        if (pMVar3 == (Material *)0x0) {
          uVar17 = 0;
        }
        else {
          uVar17 = (**(code **)(*(long *)local_f0 + 0x38))(local_f0,pMVar3);
        }
        *(undefined8 *)(lVar16 + uVar23 * 8) = uVar17;
        lVar18 = (**(code **)(*(long *)local_f0 + 0x30))(local_f0,pMVar3);
        if (lVar18 == 0) {
          lVar18 = (**(code **)(*(long *)pbVar10 + 0x20))(pbVar10,0x10,1);
          puVar32 = *(undefined8 **)(lVar18 + 8);
          *(int *)((long)puVar32 + 0xc) = pMVar3->m_flags;
          *puVar32 = *(undefined8 *)&pMVar3->m_kLST;
          *(btScalar *)(puVar32 + 1) = pMVar3->m_kVST;
          (**(code **)(*(long *)pbVar10 + 0x28))
                    (pbVar10,lVar18,"SoftBodyMaterialData",0x544d4253,pMVar3);
        }
      }
      (**(code **)(*(long *)local_f0 + 0x28))
                (local_f0,local_e8,"SoftBodyMaterialData",0x59415241,local_e0);
    }
  }
  iVar15 = (this->m_nodes).m_size;
  *(int *)((long)local_f8 + 0x15c) = iVar15;
  if (iVar15 == 0) {
    *(undefined8 *)((long)local_f8 + 0x120) = 0;
  }
  else {
    lVar16 = (**(code **)(*(long *)serializer + 0x38))(serializer,&this->m_nodes);
    *(long *)((long)local_f8 + 0x120) = lVar16;
    if (lVar16 != 0) {
      iVar15 = *(int *)((long)local_f8 + 0x15c);
      local_e0 = &this->m_nodes;
      local_e8 = (Pose *)(**(code **)(*(long *)serializer + 0x20))(serializer,0x68,iVar15);
      pfVar29 = (float *)(*(long *)&local_e8->m_pos + 0x38);
      for (i = 0; i < iVar15; i = i + 1) {
        btVector3::serializeFloat(&(this->m_nodes).m_data[i].m_f,(btVector3FloatData *)pfVar29);
        lVar16 = (long)i;
        pNVar22 = (this->m_nodes).m_data;
        pfVar29[9] = pNVar22[lVar16].m_area;
        pfVar29[10] = (float)-((byte)pNVar22[lVar16].field_0x70 & 1);
        ((btVector3FloatData *)(pfVar29 + 8))->m_floats[0] = pNVar22[lVar16].m_im;
        if (pNVar22[lVar16].super_Feature.m_material == (Material *)0x0) {
          uVar17 = 0;
        }
        else {
          uVar17 = (**(code **)(*(long *)serializer + 0x38))(serializer);
          lVar16 = (long)i;
          pNVar22 = (this->m_nodes).m_data;
        }
        *(undefined8 *)(pfVar29 + -0xe) = uVar17;
        btVector3::serializeFloat(&pNVar22[lVar16].m_n,(btVector3FloatData *)(pfVar29 + 4));
        btVector3::serializeFloat
                  (&(this->m_nodes).m_data[i].m_x,(btVector3FloatData *)(pfVar29 + -0xc));
        btVector3::serializeFloat
                  (&(this->m_nodes).m_data[i].m_q,(btVector3FloatData *)(pfVar29 + -8));
        btVector3::serializeFloat
                  (&(this->m_nodes).m_data[i].m_v,(btVector3FloatData *)(pfVar29 + -4));
        local_d0.m_pointer = (this->m_nodes).m_data + i;
        btHashMap<btHashPtr,_int>::insert(&m_nodeIndexMap,(btHashPtr *)&local_d0,&i);
        pfVar29 = pfVar29 + 0x1a;
      }
      (**(code **)(*(long *)serializer + 0x28))
                (serializer,local_e8,"SoftBodyNodeData",0x444e4253,local_e0);
    }
  }
  iVar15 = (this->m_links).m_size;
  *(int *)((long)local_f8 + 0x160) = iVar15;
  if (iVar15 == 0) {
    *(undefined8 *)((long)local_f8 + 0x128) = 0;
  }
  else {
    lVar16 = (**(code **)(*(long *)serializer + 0x38))(serializer,(this->m_links).m_data);
    *(long *)((long)local_f8 + 0x128) = lVar16;
    if (lVar16 != 0) {
      uVar2 = *(uint *)((long)local_f8 + 0x160);
      auVar35 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x18,uVar2);
      uVar23 = auVar35._8_8_;
      uVar33 = 0;
      uVar34 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar34 = uVar33;
      }
      piVar30 = (int *)(*(long *)(auVar35._0_8_ + 8) + 0x14);
      for (; serializer = local_f0, pLVar26 = (this->m_links).m_data, uVar34 * 0x48 - uVar33 != 0;
          uVar33 = uVar33 + 0x48) {
        *piVar30 = -(*(byte *)((long)(&pLVar26->m_c3 + -1) + uVar33) & 1);
        lVar16 = *(long *)((long)pLVar26->m_n + (uVar33 - 8));
        if (lVar16 == 0) {
          auVar36._8_8_ = 0;
          auVar36._0_8_ = uVar23;
          auVar36 = auVar36 << 0x40;
        }
        else {
          auVar36 = (**(code **)(*(long *)local_f0 + 0x38))(local_f0,lVar16,uVar23);
          pLVar26 = (this->m_links).m_data;
        }
        uVar23 = auVar36._8_8_;
        *(long *)(piVar30 + -5) = auVar36._0_8_;
        lVar16 = *(long *)((long)pLVar26->m_n + uVar33);
        iVar12 = -1;
        iVar15 = iVar12;
        if (lVar16 != 0) {
          lVar16 = lVar16 - (long)(this->m_nodes).m_data;
          iVar15 = (int)(lVar16 / 0x78);
          uVar23 = lVar16 % 0x78;
        }
        piVar30[-3] = iVar15;
        lVar16 = *(long *)((long)pLVar26->m_n + uVar33 + 8);
        if (lVar16 != 0) {
          lVar16 = lVar16 - (long)(this->m_nodes).m_data;
          iVar12 = (int)(lVar16 / 0x78);
          uVar23 = lVar16 % 0x78;
        }
        piVar30[-2] = iVar12;
        piVar30[-1] = *(int *)((long)pLVar26->m_n + uVar33 + 0x10);
        piVar30 = piVar30 + 6;
      }
      (**(code **)(*(long *)local_f0 + 0x28))(local_f0,auVar35._0_8_,"SoftBodyLinkData",0x59415241);
    }
  }
  iVar15 = (this->m_faces).m_size;
  *(int *)((long)local_f8 + 0x164) = iVar15;
  if (iVar15 == 0) {
    *(undefined8 *)((long)local_f8 + 0x130) = 0;
  }
  else {
    lVar16 = (**(code **)(*(long *)serializer + 0x38))(serializer,(this->m_faces).m_data);
    *(long *)((long)local_f8 + 0x130) = lVar16;
    if (lVar16 != 0) {
      uVar2 = *(uint *)((long)local_f8 + 0x164);
      local_e8 = (Pose *)(**(code **)(*(long *)serializer + 0x20))(serializer,0x28,uVar2);
      lVar16 = 0x10;
      pfVar29 = *(float **)&local_e8->m_pos;
      ptVar31 = (tNodeArray *)0x0;
      local_e0 = (tNodeArray *)(ulong)uVar2;
      if ((int)uVar2 < 1) {
        local_e0 = ptVar31;
      }
      for (; pFVar24 = (this->m_faces).m_data, ptVar31 != local_e0;
          ptVar31 = (tNodeArray *)&ptVar31->field_0x1) {
        if (pFVar24[(long)ptVar31].super_Feature.m_material == (Material *)0x0) {
          uVar17 = 0;
        }
        else {
          uVar17 = (**(code **)(*(long *)local_f0 + 0x38))();
          pFVar24 = (this->m_faces).m_data;
        }
        *(undefined8 *)((btVector3FloatData *)(pfVar29 + 4))->m_floats = uVar17;
        btVector3::serializeFloat(&pFVar24[(long)ptVar31].m_normal,(btVector3FloatData *)pfVar29);
        pNVar22 = (this->m_nodes).m_data;
        pFVar24 = (this->m_faces).m_data;
        for (lVar18 = 0; lVar18 != 3; lVar18 = lVar18 + 1) {
          lVar4 = *(long *)((long)pFVar24->m_n + lVar18 * 8 + lVar16 + -0x10);
          uVar13 = 0xffffffff;
          if (lVar4 != 0) {
            uVar13 = (undefined4)((lVar4 - (long)pNVar22) / 0x78);
          }
          pfVar29[lVar18 + 6] = (float)uVar13;
        }
        pfVar29[9] = pFVar24[(long)ptVar31].m_ra;
        pfVar29 = pfVar29 + 10;
        lVar16 = lVar16 + 0x48;
        serializer = local_f0;
      }
      (**(code **)(*(long *)serializer + 0x28))(serializer,local_e8,"SoftBodyFaceData",0x59415241);
    }
  }
  iVar15 = (this->m_tetras).m_size;
  *(int *)((long)local_f8 + 0x168) = iVar15;
  if (iVar15 == 0) {
    *(undefined8 *)((long)local_f8 + 0x138) = 0;
  }
  else {
    lVar16 = (**(code **)(*(long *)serializer + 0x38))(serializer,(this->m_tetras).m_data);
    *(long *)((long)local_f8 + 0x138) = lVar16;
    if (lVar16 != 0) {
      uVar2 = *(uint *)((long)local_f8 + 0x168);
      local_c8 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x68,uVar2);
      ptVar31 = *(tNodeArray **)(local_c8 + 8);
      pPVar27 = (Pose *)0x0;
      local_c0 = (Pose *)(ulong)uVar2;
      if ((int)uVar2 < 1) {
        local_c0 = pPVar27;
      }
      piVar30 = &((tFaceArray *)(ptVar31 + 2))->m_capacity;
      lVar16 = 0x40;
      for (; serializer = local_f0, pPVar27 != local_c0; pPVar27 = (Pose *)&pPVar27->m_bframe) {
        local_e8 = pPVar27;
        local_e0 = ptVar31;
        local_d8 = piVar30;
        local_b8 = lVar16;
        for (lVar18 = 4; ptVar11 = local_e0, pPVar27 = local_e8, pTVar25 = (this->m_tetras).m_data,
            lVar18 != 0x94; lVar18 = lVar18 + 0x24) {
          btVector3::serializeFloat
                    ((btVector3 *)((long)pTVar25->m_n + lVar16 + -0x10),
                     (btVector3FloatData *)ptVar31);
          lVar4 = *(long *)((long)((this->m_tetras).m_data)->m_n + lVar18 * 4 + -0x10);
          iVar15 = -1;
          if (lVar4 != 0) {
            iVar15 = (int)((lVar4 - (long)(this->m_nodes).m_data) / 0x78);
          }
          *piVar30 = iVar15;
          piVar30 = piVar30 + 1;
          ptVar31 = (tNodeArray *)&ptVar31->m_data;
          lVar16 = lVar16 + 0x10;
        }
        *(undefined8 *)&((tFaceArray *)(local_e0 + 2))->field_0x1c =
             *(undefined8 *)&pTVar25[(long)local_e8].m_c1;
        if (pTVar25[(long)local_e8].super_Feature.m_material == (Material *)0x0) {
          uVar17 = 0;
        }
        else {
          uVar17 = (**(code **)(*(long *)local_f0 + 0x38))();
          pTVar25 = (this->m_tetras).m_data;
        }
        *(undefined8 *)(ptVar11 + 2) = uVar17;
        *(btScalar *)&((tFaceArray *)(ptVar11 + 2))->m_ownsMemory = pTVar25[(long)pPVar27].m_rv;
        ptVar31 = (tNodeArray *)&((tTetraArray *)(ptVar11 + 3))->m_capacity;
        piVar30 = local_d8 + 0x1a;
        lVar16 = local_b8 + 0x88;
      }
      (**(code **)(*(long *)local_f0 + 0x28))
                (local_f0,local_c8,"SoftBodyTetraData",0x59415241,(this->m_tetras).m_data);
    }
  }
  iVar15 = (this->m_anchors).m_size;
  *(int *)((long)local_f8 + 0x16c) = iVar15;
  if (iVar15 == 0) {
    *(undefined8 *)((long)local_f8 + 0x140) = 0;
  }
  else {
    lVar16 = (**(code **)(*(long *)serializer + 0x38))(serializer,(this->m_anchors).m_data);
    *(long *)((long)local_f8 + 0x140) = lVar16;
    if (lVar16 != 0) {
      uVar2 = *(uint *)((long)local_f8 + 0x16c);
      lVar16 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x60,uVar2);
      pbVar28 = *(btMatrix3x3FloatData **)(lVar16 + 8);
      uVar23 = 0;
      uVar34 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar34 = uVar23;
      }
      for (; serializer = local_f0, uVar34 * 0x68 - uVar23 != 0; uVar23 = uVar23 + 0x68) {
        btMatrix3x3::serializeFloat
                  ((btMatrix3x3 *)
                   ((long)(((this->m_anchors).m_data)->m_c0).m_el[0].m_floats + uVar23),pbVar28);
        btVector3::serializeFloat
                  ((btVector3 *)((long)(((this->m_anchors).m_data)->m_c1).m_floats + uVar23),
                   pbVar28[1].m_el);
        pAVar5 = (this->m_anchors).m_data;
        pbVar28[1].m_el[2].m_floats[3] = *(float *)((long)(&pAVar5->m_c1 + 1) + uVar23);
        btVector3::serializeFloat
                  ((btVector3 *)((long)(pAVar5->m_local).m_floats + uVar23),pbVar28[1].m_el + 1);
        pAVar5 = (this->m_anchors).m_data;
        lVar18 = *(long *)((long)(pAVar5->m_local).m_floats + (uVar23 - 8));
        fVar14 = -NAN;
        if (lVar18 != 0) {
          fVar14 = (float)((lVar18 - (long)(this->m_nodes).m_data) / 0x78);
        }
        pbVar28[1].m_el[2].m_floats[2] = fVar14;
        if (*(long *)((long)(pAVar5->m_c0).m_el[0].m_floats + (uVar23 - 0xc)) == 0) {
          uVar17 = 0;
        }
        else {
          uVar17 = (**(code **)(*(long *)local_f0 + 0x38))();
        }
        *(undefined8 *)pbVar28[1].m_el[2].m_floats = uVar17;
        pbVar28 = pbVar28 + 2;
      }
      (**(code **)(*(long *)local_f0 + 0x28))(local_f0,lVar16,"SoftRigidAnchorData",0x59415241);
    }
  }
  *(btScalar *)((long)local_f8 + 0x194) = (this->m_cfg).kDF;
  *(btScalar *)((long)local_f8 + 0x18c) = (this->m_cfg).kPR;
  *(_ *)((long)local_f8 + 0x178) = (this->m_cfg).aeromodel;
  uVar17 = *(undefined8 *)&(this->m_cfg).diterations;
  *(undefined8 *)((long)local_f8 + 0x1cc) = *(undefined8 *)&(this->m_cfg).viterations;
  *(undefined8 *)((long)local_f8 + 0x1d4) = uVar17;
  bVar1 = (this->m_cfg).maxvolume;
  uVar17 = *(undefined8 *)&(this->m_cfg).kDG;
  *(undefined8 *)((long)local_f8 + 0x17c) = *(undefined8 *)&(this->m_cfg).kVCF;
  *(undefined8 *)((long)local_f8 + 0x184) = uVar17;
  *(int *)((long)local_f8 + 0x1dc) = (this->m_cfg).collisions;
  *(btScalar *)((long)local_f8 + 400) = (this->m_cfg).kVC;
  uVar17 = *(undefined8 *)&(this->m_cfg).kKHR;
  *(undefined8 *)((long)local_f8 + 0x198) = *(undefined8 *)&(this->m_cfg).kMT;
  *(undefined8 *)((long)local_f8 + 0x1a0) = uVar17;
  *(btScalar *)((long)local_f8 + 0x1c8) = (this->m_cfg).timescale;
  *(btScalar *)((long)local_f8 + 0x1c4) = bVar1;
  uVar17 = *(undefined8 *)&(this->m_cfg).kSKHR_CL;
  *(undefined8 *)((long)local_f8 + 0x1a8) = *(undefined8 *)&(this->m_cfg).kAHR;
  *(undefined8 *)((long)local_f8 + 0x1b0) = uVar17;
  *(undefined8 *)((long)local_f8 + 0x1b8) = *(undefined8 *)&(this->m_cfg).kSR_SPLT_CL;
  *(btScalar *)((long)local_f8 + 0x1c0) = (this->m_cfg).kSS_SPLT_CL;
  pPVar27 = &this->m_pose;
  uVar17 = (**(code **)(*(long *)serializer + 0x38))(serializer,pPVar27);
  *(undefined8 *)((long)local_f8 + 0x110) = uVar17;
  local_e0 = (tNodeArray *)(**(code **)(*(long *)serializer + 0x20))(serializer,200,1);
  pbVar28 = *(btMatrix3x3FloatData **)((long)local_e0 + 8);
  btMatrix3x3::serializeFloat(&(this->m_pose).m_aqq,pbVar28 + 2);
  pbVar28[3].m_el[2].m_floats[3] = (float)(uint)(this->m_pose).m_bframe;
  pbVar28[3].m_el[2].m_floats[2] = (float)(uint)(this->m_pose).m_bvolume;
  btVector3::serializeFloat(&(this->m_pose).m_com,pbVar28[3].m_el);
  fVar14 = (float)(this->m_pose).m_pos.m_size;
  pbVar28[3].m_el[2].m_floats[0] = fVar14;
  if (fVar14 == 0.0) {
    pbVar28[3].m_el[1].m_floats[0] = 0.0;
    pbVar28[3].m_el[1].m_floats[1] = 0.0;
  }
  else {
    uVar17 = (**(code **)(*(long *)serializer + 0x38))(serializer,(this->m_pose).m_pos.m_data);
    fVar14 = pbVar28[3].m_el[2].m_floats[0];
    *(undefined8 *)pbVar28[3].m_el[1].m_floats = uVar17;
    if (fVar14 != 0.0) {
      local_e8 = pPVar27;
      lVar18 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x10,fVar14);
      lVar16 = *(long *)(lVar18 + 8);
      uVar23 = 0;
      uVar34 = (ulong)(uint)fVar14;
      if ((int)fVar14 < 1) {
        uVar34 = uVar23;
      }
      for (; serializer = local_f0, uVar34 * 0x10 != uVar23; uVar23 = uVar23 + 0x10) {
        btVector3::serializeFloat
                  ((btVector3 *)((long)((this->m_pose).m_pos.m_data)->m_floats + uVar23),
                   (btVector3FloatData *)(lVar16 + uVar23));
      }
      (**(code **)(*(long *)local_f0 + 0x28))(local_f0,lVar18,"btVector3FloatData",0x59415241);
      pPVar27 = local_e8;
    }
  }
  pbVar28[4].m_el[0].m_floats[0] = (this->m_pose).m_volume;
  btMatrix3x3::serializeFloat(&(this->m_pose).m_rot,pbVar28);
  btMatrix3x3::serializeFloat(&(this->m_pose).m_scl,pbVar28 + 1);
  fVar14 = (float)(this->m_pose).m_wgh.m_size;
  pbVar28[3].m_el[2].m_floats[1] = fVar14;
  if (fVar14 == 0.0) {
    pbVar28[3].m_el[1].m_floats[2] = 0.0;
    pbVar28[3].m_el[1].m_floats[3] = 0.0;
  }
  else {
    uVar17 = (**(code **)(*(long *)serializer + 0x38))(serializer,(this->m_pose).m_wgh.m_data);
    fVar14 = pbVar28[3].m_el[2].m_floats[1];
    *(undefined8 *)(pbVar28[3].m_el[1].m_floats + 2) = uVar17;
    if (fVar14 != 0.0) {
      lVar18 = (**(code **)(*(long *)serializer + 0x20))(serializer,4,fVar14);
      lVar16 = *(long *)(lVar18 + 8);
      pfVar29 = (this->m_pose).m_wgh.m_data;
      uVar23 = 0;
      uVar34 = (ulong)(uint)fVar14;
      if ((int)fVar14 < 1) {
        uVar34 = uVar23;
      }
      for (; uVar34 != uVar23; uVar23 = uVar23 + 1) {
        *(float *)(lVar16 + uVar23 * 4) = pfVar29[uVar23];
      }
      (**(code **)(*(long *)serializer + 0x28))(serializer,lVar18,"float",0x59415241);
    }
  }
  (**(code **)(*(long *)serializer + 0x28))
            (serializer,local_e0,"SoftBodyPoseData",0x59415241,pPVar27);
  iVar15 = (this->m_clusters).m_size;
  *(int *)((long)local_f8 + 0x170) = iVar15;
  if (iVar15 == 0) {
    *(undefined8 *)((long)local_f8 + 0x148) = 0;
  }
  else {
    uVar17 = (**(code **)(*(long *)serializer + 0x38))(serializer,*(this->m_clusters).m_data);
    uVar2 = *(uint *)((long)local_f8 + 0x170);
    *(undefined8 *)((long)local_f8 + 0x148) = uVar17;
    if (uVar2 != 0) {
      local_d8 = (int *)(**(code **)(*(long *)serializer + 0x20))(serializer,0x168,uVar2);
      if ((int)uVar2 < 1) {
        uVar2 = 0;
      }
      ptVar31 = (tNodeArray *)(ulong)uVar2;
      pFVar24 = *(Face **)(local_d8 + 2);
      local_e0 = ptVar31;
      for (uVar34 = 0; ppCVar6 = (this->m_clusters).m_data, (tNodeArray *)uVar34 != ptVar31;
          uVar34 = uVar34 + 1) {
        pCVar7 = ppCVar6[uVar34];
        pFVar24[4].m_normal.m_floats[1] = pCVar7->m_adamping;
        btVector3::serializeFloat(&pCVar7->m_av,(btVector3FloatData *)&pFVar24[3].m_normal);
        pCVar7 = (this->m_clusters).m_data[uVar34];
        *(int *)((long)&pFVar24[4].m_leaf + 4) = pCVar7->m_clusterIndex;
        *(uint *)&pFVar24[4].m_leaf = (uint)pCVar7->m_collide;
        btVector3::serializeFloat(&pCVar7->m_com,(btVector3FloatData *)pFVar24[2].m_n);
        pCVar7 = (this->m_clusters).m_data[uVar34];
        *(uint *)&pFVar24[4].field_0x3c = (uint)pCVar7->m_containsAnchor;
        btVector3::serializeFloat(pCVar7->m_dimpulses,(btVector3FloatData *)&pFVar24[2].m_leaf);
        btVector3::serializeFloat
                  ((this->m_clusters).m_data[uVar34]->m_dimpulses + 1,
                   (btVector3FloatData *)&pFVar24[3].super_Feature.m_material);
        btTransform::serializeFloat
                  (&(this->m_clusters).m_data[uVar34]->m_framexform,(btTransformFloatData *)pFVar24)
        ;
        pCVar7 = (this->m_clusters).m_data[uVar34];
        *(undefined8 *)((long)pFVar24[4].m_n + 4) = *(undefined8 *)&pCVar7->m_idmass;
        btMatrix3x3::serializeFloat(&pCVar7->m_invwi,(btMatrix3x3FloatData *)&pFVar24[1].m_normal);
        pCVar7 = (this->m_clusters).m_data[uVar34];
        pFVar24[4].m_normal.m_floats[0] = pCVar7->m_ldamping;
        btMatrix3x3::serializeFloat(&pCVar7->m_locii,(btMatrix3x3FloatData *)&pFVar24->m_leaf);
        btVector3::serializeFloat
                  (&(this->m_clusters).m_data[uVar34]->m_lv,
                   (btVector3FloatData *)(pFVar24[3].m_n + 1));
        pCVar7 = (this->m_clusters).m_data[uVar34];
        pFVar24[4].m_normal.m_floats[3] = pCVar7->m_maxSelfCollisionImpulse;
        bVar1 = pCVar7->m_adamping;
        bVar9 = pCVar7->m_matching;
        *(undefined8 *)((long)pFVar24[4].m_n + 0x14) = *(undefined8 *)&pCVar7->m_ndamping;
        pFVar24[4].m_normal.m_floats[1] = bVar1;
        pFVar24[4].m_normal.m_floats[2] = bVar9;
        pFVar24[4].m_ra = pCVar7->m_selfCollisionImpulseFactor;
        *(int *)&pFVar24[4].super_Feature.m_material = (pCVar7->m_framerefs).m_size;
        *(int *)pFVar24[4].m_n = (pCVar7->m_masses).m_size;
        *(int *)((long)&pFVar24[4].super_Feature.m_material + 4) = (pCVar7->m_nodes).m_size;
        *(int *)((long)pFVar24[4].m_n + 0xc) = pCVar7->m_nvimpulses;
        btVector3::serializeFloat(pCVar7->m_vimpulses,(btVector3FloatData *)(pFVar24[2].m_n + 2));
        btVector3::serializeFloat
                  ((this->m_clusters).m_data[uVar34]->m_vimpulses + 1,
                   (btVector3FloatData *)(pFVar24[2].m_normal.m_floats + 2));
        pCVar7 = (this->m_clusters).m_data[uVar34];
        *(int *)(pFVar24[4].m_n + 2) = pCVar7->m_ndimpulses;
        if (*(int *)&pFVar24[4].super_Feature.m_material == 0) {
          *(undefined8 *)&pFVar24[3].m_ra = 0;
        }
        else {
          lVar16 = (**(code **)(*(long *)serializer + 0x38))
                             (serializer,(pCVar7->m_framerefs).m_data);
          *(long *)&pFVar24[3].m_ra = lVar16;
          if (lVar16 != 0) {
            uVar2 = *(uint *)&pFVar24[4].super_Feature.m_material;
            local_e8 = (Pose *)(**(code **)(*(long *)serializer + 0x20))(serializer,0x10,uVar2);
            lVar16 = *(long *)&local_e8->m_pos;
            if ((int)uVar2 < 1) {
              uVar2 = 0;
            }
            for (lVar18 = 0; serializer = local_f0, (ulong)uVar2 * 0x10 != lVar18;
                lVar18 = lVar18 + 0x10) {
              btVector3::serializeFloat
                        ((btVector3 *)
                         ((long)(((this->m_clusters).m_data[uVar34]->m_framerefs).m_data)->m_floats
                         + lVar18),(btVector3FloatData *)(lVar16 + lVar18));
            }
            (**(code **)(*(long *)local_f0 + 0x28))
                      (local_f0,local_e8,"btVector3FloatData",0x59415241);
            ptVar31 = local_e0;
          }
        }
        if (*(int *)pFVar24[4].m_n == 0) {
          pFVar24[4].super_Feature.super_Element.m_tag = (void *)0x0;
        }
        else {
          pvVar19 = (void *)(**(code **)(*(long *)serializer + 0x38))
                                      (serializer,
                                       ((this->m_clusters).m_data[uVar34]->m_masses).m_data);
          pFVar24[4].super_Feature.super_Element.m_tag = pvVar19;
          if (pvVar19 != (void *)0x0) {
            uVar2 = *(uint *)pFVar24[4].m_n;
            lVar18 = (**(code **)(*(long *)serializer + 0x20))(serializer,4,uVar2);
            lVar16 = *(long *)(lVar18 + 8);
            ppCVar6 = (this->m_clusters).m_data;
            if ((int)uVar2 < 1) {
              uVar2 = 0;
            }
            for (uVar23 = 0; uVar2 != uVar23; uVar23 = uVar23 + 1) {
              *(float *)(lVar16 + uVar23 * 4) = (ppCVar6[uVar34]->m_masses).m_data[uVar23];
            }
            (**(code **)(*(long *)serializer + 0x28))
                      (serializer,lVar18,"float",0x59415241,
                       ((this->m_clusters).m_data[uVar34]->m_masses).m_data);
          }
        }
        if (*(float *)((long)&pFVar24[4].super_Feature.m_material + 4) == 0.0) {
          pFVar24[3].m_leaf = (btDbvtNode *)0x0;
        }
        else {
          pbVar20 = (btDbvtNode *)
                    (**(code **)(*(long *)serializer + 0x38))
                              (serializer,&(this->m_clusters).m_data[uVar34]->m_nodes);
          pFVar24[3].m_leaf = pbVar20;
          if (pbVar20 != (btDbvtNode *)0x0) {
            uVar2 = *(uint *)pFVar24[4].m_n;
            local_e8 = (Pose *)(**(code **)(*(long *)serializer + 0x20))(serializer,4,uVar2);
            lVar16 = *(long *)&local_e8->m_pos;
            if ((int)uVar2 < 1) {
              uVar2 = 0;
            }
            for (uVar23 = 0; serializer = local_f0, uVar2 != uVar23; uVar23 = uVar23 + 1) {
              local_d0 = *(anon_union_8_2_511b660c_for_btHashPtr_0 *)
                          (((this->m_clusters).m_data[uVar34]->m_nodes).m_data + uVar23);
              piVar30 = btHashMap<btHashPtr,_int>::find(&m_nodeIndexMap,(btHashPtr *)&local_d0);
              *(int *)(lVar16 + uVar23 * 4) = *piVar30;
            }
            (**(code **)(*(long *)local_f0 + 0x28))
                      (local_f0,local_e8,"int",0x59415241,
                       &(this->m_clusters).m_data[uVar34]->m_nodes);
            ptVar31 = local_e0;
          }
        }
        pFVar24 = pFVar24 + 5;
      }
      (**(code **)(*(long *)serializer + 0x28))
                (serializer,local_d8,"SoftBodyClusterData",0x59415241,*ppCVar6);
    }
  }
  iVar15 = (this->m_joints).m_size;
  *(int *)((long)local_f8 + 0x174) = iVar15;
  if (iVar15 == 0) {
    *(undefined8 *)((long)local_f8 + 0x150) = 0;
  }
  else {
    lVar16 = (**(code **)(*(long *)serializer + 0x38))(serializer,(this->m_joints).m_data);
    *(long *)((long)local_f8 + 0x150) = lVar16;
    if (lVar16 != 0) {
      uVar2 = (this->m_joints).m_size;
      local_f0 = (btSerializer *)(**(code **)(*(long *)serializer + 0x20))(serializer,0x70,uVar2);
      puVar32 = *(undefined8 **)(local_f0 + 8);
      uVar23 = 0;
      uVar34 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar34 = uVar23;
      }
      for (; uVar23 != uVar34; uVar23 = uVar23 + 1) {
        iVar15 = (*(this->m_joints).m_data[uVar23]->_vptr_Joint[5])();
        *(int *)(puVar32 + 0xd) = iVar15;
        btVector3::serializeFloat
                  ((this->m_joints).m_data[uVar23]->m_refs,(btVector3FloatData *)(puVar32 + 2));
        btVector3::serializeFloat
                  ((this->m_joints).m_data[uVar23]->m_refs + 1,(btVector3FloatData *)(puVar32 + 4));
        ppJVar8 = (this->m_joints).m_data;
        pJVar21 = ppJVar8[uVar23];
        puVar32[6] = *(undefined8 *)&pJVar21->m_cfm;
        *(btScalar *)(puVar32 + 7) = pJVar21->m_split;
        *(uint *)((long)puVar32 + 0x3c) = (uint)pJVar21->m_delete;
        for (lVar16 = 0x14; lVar16 != 0x18; lVar16 = lVar16 + 1) {
          *(undefined4 *)((long)puVar32 + lVar16 * 4 + -0x10) = 0;
          *(undefined4 *)((long)puVar32 + lVar16 * 4) = 0;
        }
        *puVar32 = 0;
        puVar32[1] = 0;
        pJVar21 = ppJVar8[uVar23];
        if (pJVar21->m_bodies[0].m_soft != (Cluster *)0x0) {
          *(undefined4 *)(puVar32 + 0xc) = 1;
          uVar17 = (**(code **)(*(long *)serializer + 0x38))(serializer);
          *puVar32 = uVar17;
          pJVar21 = (this->m_joints).m_data[uVar23];
        }
        if (pJVar21->m_bodies[0].m_collisionObject != (btCollisionObject *)0x0) {
          *(undefined4 *)(puVar32 + 0xc) = 3;
          uVar17 = (**(code **)(*(long *)serializer + 0x38))(serializer);
          *puVar32 = uVar17;
          pJVar21 = (this->m_joints).m_data[uVar23];
        }
        if (pJVar21->m_bodies[0].m_rigid != (btRigidBody *)0x0) {
          *(undefined4 *)(puVar32 + 0xc) = 2;
          uVar17 = (**(code **)(*(long *)serializer + 0x38))(serializer);
          *puVar32 = uVar17;
          pJVar21 = (this->m_joints).m_data[uVar23];
        }
        if (pJVar21->m_bodies[1].m_soft != (Cluster *)0x0) {
          *(undefined4 *)((long)puVar32 + 100) = 1;
          uVar17 = (**(code **)(*(long *)serializer + 0x38))(serializer);
          puVar32[1] = uVar17;
          pJVar21 = (this->m_joints).m_data[uVar23];
        }
        if (pJVar21->m_bodies[1].m_collisionObject != (btCollisionObject *)0x0) {
          *(undefined4 *)((long)puVar32 + 100) = 3;
          uVar17 = (**(code **)(*(long *)serializer + 0x38))(serializer);
          puVar32[1] = uVar17;
          pJVar21 = (this->m_joints).m_data[uVar23];
        }
        if (pJVar21->m_bodies[1].m_rigid != (btRigidBody *)0x0) {
          *(undefined4 *)((long)puVar32 + 100) = 2;
          uVar17 = (**(code **)(*(long *)serializer + 0x38))(serializer);
          puVar32[1] = uVar17;
        }
        puVar32 = puVar32 + 0xe;
      }
      (**(code **)(*(long *)serializer + 0x28))
                (serializer,local_f0,"btSoftBodyJointData",0x59415241);
    }
  }
  btHashMap<btHashPtr,_int>::~btHashMap(&m_nodeIndexMap);
  return "btSoftBodyFloatData";
}

Assistant:

const char*	btSoftBody::serialize(void* dataBuffer, class btSerializer* serializer) const
{
	btSoftBodyData* sbd = (btSoftBodyData*) dataBuffer;

	btCollisionObject::serialize(&sbd->m_collisionObjectData, serializer);

	btHashMap<btHashPtr,int>	m_nodeIndexMap;

	sbd->m_numMaterials = m_materials.size();
	sbd->m_materials = sbd->m_numMaterials? (SoftBodyMaterialData**) serializer->getUniquePointer((void*)&m_materials): 0;

	if (sbd->m_materials)
	{
		int sz = sizeof(SoftBodyMaterialData*);
		int numElem = sbd->m_numMaterials;
		btChunk* chunk = serializer->allocate(sz,numElem);
		//SoftBodyMaterialData** memPtr = chunk->m_oldPtr;
		SoftBodyMaterialData** memPtr = (SoftBodyMaterialData**)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			btSoftBody::Material* mat = m_materials[i];
			*memPtr = mat ? (SoftBodyMaterialData*)serializer->getUniquePointer((void*)mat) : 0;
			if (!serializer->findPointer(mat))
			{
				//serialize it here
				btChunk* chunk = serializer->allocate(sizeof(SoftBodyMaterialData),1);
				SoftBodyMaterialData* memPtr = (SoftBodyMaterialData*)chunk->m_oldPtr;
				memPtr->m_flags = mat->m_flags;
				memPtr->m_angularStiffness = mat->m_kAST;
				memPtr->m_linearStiffness = mat->m_kLST;
				memPtr->m_volumeStiffness = mat->m_kVST;
				serializer->finalizeChunk(chunk,"SoftBodyMaterialData",BT_SBMATERIAL_CODE,mat);
			}
		}
		serializer->finalizeChunk(chunk,"SoftBodyMaterialData",BT_ARRAY_CODE,(void*) &m_materials);
	}


	

	sbd->m_numNodes = m_nodes.size();
	sbd->m_nodes = sbd->m_numNodes ? (SoftBodyNodeData*)serializer->getUniquePointer((void*)&m_nodes): 0;
	if (sbd->m_nodes)
	{
		int sz = sizeof(SoftBodyNodeData);
		int numElem = sbd->m_numNodes;
		btChunk* chunk = serializer->allocate(sz,numElem);
		SoftBodyNodeData* memPtr = (SoftBodyNodeData*)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			m_nodes[i].m_f.serializeFloat( memPtr->m_accumulatedForce);
			memPtr->m_area = m_nodes[i].m_area;
			memPtr->m_attach = m_nodes[i].m_battach;
			memPtr->m_inverseMass = m_nodes[i].m_im;
			memPtr->m_material = m_nodes[i].m_material? (SoftBodyMaterialData*)serializer->getUniquePointer((void*) m_nodes[i].m_material):0;
			m_nodes[i].m_n.serializeFloat(memPtr->m_normal);
			m_nodes[i].m_x.serializeFloat(memPtr->m_position);
			m_nodes[i].m_q.serializeFloat(memPtr->m_previousPosition);
			m_nodes[i].m_v.serializeFloat(memPtr->m_velocity);
			m_nodeIndexMap.insert(&m_nodes[i],i);
		}
		serializer->finalizeChunk(chunk,"SoftBodyNodeData",BT_SBNODE_CODE,(void*) &m_nodes);
	}

	sbd->m_numLinks = m_links.size();
	sbd->m_links = sbd->m_numLinks? (SoftBodyLinkData*) serializer->getUniquePointer((void*)&m_links[0]):0;
	if (sbd->m_links)
	{
		int sz = sizeof(SoftBodyLinkData);
		int numElem = sbd->m_numLinks;
		btChunk* chunk = serializer->allocate(sz,numElem);
		SoftBodyLinkData* memPtr = (SoftBodyLinkData*)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			memPtr->m_bbending = m_links[i].m_bbending;
			memPtr->m_material = m_links[i].m_material? (SoftBodyMaterialData*)serializer->getUniquePointer((void*) m_links[i].m_material):0;
			memPtr->m_nodeIndices[0] = m_links[i].m_n[0] ? m_links[i].m_n[0] - &m_nodes[0]: -1;
			memPtr->m_nodeIndices[1] = m_links[i].m_n[1] ? m_links[i].m_n[1] - &m_nodes[0]: -1;
			btAssert(memPtr->m_nodeIndices[0]<m_nodes.size());
			btAssert(memPtr->m_nodeIndices[1]<m_nodes.size());
			memPtr->m_restLength = m_links[i].m_rl;
		}
		serializer->finalizeChunk(chunk,"SoftBodyLinkData",BT_ARRAY_CODE,(void*) &m_links[0]);

	}


	sbd->m_numFaces = m_faces.size();
	sbd->m_faces = sbd->m_numFaces? (SoftBodyFaceData*) serializer->getUniquePointer((void*)&m_faces[0]):0;
	if (sbd->m_faces)
	{
		int sz = sizeof(SoftBodyFaceData);
		int numElem = sbd->m_numFaces;
		btChunk* chunk = serializer->allocate(sz,numElem);
		SoftBodyFaceData* memPtr = (SoftBodyFaceData*)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			memPtr->m_material = m_faces[i].m_material ?  (SoftBodyMaterialData*) serializer->getUniquePointer((void*)m_faces[i].m_material): 0;
			m_faces[i].m_normal.serializeFloat(	memPtr->m_normal);
			for (int j=0;j<3;j++)
			{
				memPtr->m_nodeIndices[j] = m_faces[i].m_n[j]? m_faces[i].m_n[j] - &m_nodes[0]: -1;
			}
			memPtr->m_restArea = m_faces[i].m_ra;
		}
		serializer->finalizeChunk(chunk,"SoftBodyFaceData",BT_ARRAY_CODE,(void*) &m_faces[0]);
	}


	sbd->m_numTetrahedra = m_tetras.size();
	sbd->m_tetrahedra = sbd->m_numTetrahedra ? (SoftBodyTetraData*) serializer->getUniquePointer((void*)&m_tetras[0]):0;
	if (sbd->m_tetrahedra)
	{
		int sz = sizeof(SoftBodyTetraData);
		int numElem = sbd->m_numTetrahedra;
		btChunk* chunk = serializer->allocate(sz,numElem);
		SoftBodyTetraData* memPtr = (SoftBodyTetraData*)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			for (int j=0;j<4;j++)
			{
				m_tetras[i].m_c0[j].serializeFloat(	memPtr->m_c0[j] );
				memPtr->m_nodeIndices[j] = m_tetras[j].m_n[j]? m_tetras[j].m_n[j]-&m_nodes[0] : -1;
			}
			memPtr->m_c1 = m_tetras[i].m_c1;
			memPtr->m_c2 = m_tetras[i].m_c2;
			memPtr->m_material = m_tetras[i].m_material ? (SoftBodyMaterialData*)serializer->getUniquePointer((void*) m_tetras[i].m_material): 0;
			memPtr->m_restVolume = m_tetras[i].m_rv;
		}
		serializer->finalizeChunk(chunk,"SoftBodyTetraData",BT_ARRAY_CODE,(void*) &m_tetras[0]);
	}

	sbd->m_numAnchors = m_anchors.size();
	sbd->m_anchors = sbd->m_numAnchors ? (SoftRigidAnchorData*) serializer->getUniquePointer((void*)&m_anchors[0]):0;
	if (sbd->m_anchors)
	{
		int sz = sizeof(SoftRigidAnchorData);
		int numElem = sbd->m_numAnchors;
		btChunk* chunk = serializer->allocate(sz,numElem);
		SoftRigidAnchorData* memPtr = (SoftRigidAnchorData*)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			m_anchors[i].m_c0.serializeFloat(memPtr->m_c0);
			m_anchors[i].m_c1.serializeFloat(memPtr->m_c1);
			memPtr->m_c2 = m_anchors[i].m_c2;
			m_anchors[i].m_local.serializeFloat(memPtr->m_localFrame);
			memPtr->m_nodeIndex = m_anchors[i].m_node? m_anchors[i].m_node-&m_nodes[0]: -1;
			
			memPtr->m_rigidBody = m_anchors[i].m_body? (btRigidBodyData*)  serializer->getUniquePointer((void*)m_anchors[i].m_body): 0;
			btAssert(memPtr->m_nodeIndex < m_nodes.size());
		}
		serializer->finalizeChunk(chunk,"SoftRigidAnchorData",BT_ARRAY_CODE,(void*) &m_anchors[0]);
	}
	

	sbd->m_config.m_dynamicFriction = m_cfg.kDF;
	sbd->m_config.m_baumgarte = m_cfg.kVCF;
	sbd->m_config.m_pressure = m_cfg.kPR;
	sbd->m_config.m_aeroModel = this->m_cfg.aeromodel;
	sbd->m_config.m_lift = m_cfg.kLF;
	sbd->m_config.m_drag = m_cfg.kDG;
	sbd->m_config.m_positionIterations = m_cfg.piterations;
	sbd->m_config.m_driftIterations = m_cfg.diterations;
	sbd->m_config.m_clusterIterations = m_cfg.citerations;
	sbd->m_config.m_velocityIterations = m_cfg.viterations;
	sbd->m_config.m_maxVolume = m_cfg.maxvolume;
	sbd->m_config.m_damping = m_cfg.kDP;
	sbd->m_config.m_poseMatch = m_cfg.kMT;
	sbd->m_config.m_collisionFlags = m_cfg.collisions;
	sbd->m_config.m_volume = m_cfg.kVC;
	sbd->m_config.m_rigidContactHardness = m_cfg.kCHR;
	sbd->m_config.m_kineticContactHardness = m_cfg.kKHR;
	sbd->m_config.m_softContactHardness = m_cfg.kSHR;
	sbd->m_config.m_anchorHardness = m_cfg.kAHR;
	sbd->m_config.m_timeScale = m_cfg.timescale;
	sbd->m_config.m_maxVolume = m_cfg.maxvolume;
	sbd->m_config.m_softRigidClusterHardness = m_cfg.kSRHR_CL;
	sbd->m_config.m_softKineticClusterHardness = m_cfg.kSKHR_CL;
	sbd->m_config.m_softSoftClusterHardness = m_cfg.kSSHR_CL;
	sbd->m_config.m_softRigidClusterImpulseSplit = m_cfg.kSR_SPLT_CL;
	sbd->m_config.m_softKineticClusterImpulseSplit = m_cfg.kSK_SPLT_CL;
	sbd->m_config.m_softSoftClusterImpulseSplit = m_cfg.kSS_SPLT_CL;

	//pose for shape matching
	{
		sbd->m_pose = (SoftBodyPoseData*)serializer->getUniquePointer((void*)&m_pose);

		int sz = sizeof(SoftBodyPoseData);
		btChunk* chunk = serializer->allocate(sz,1);
		SoftBodyPoseData* memPtr = (SoftBodyPoseData*)chunk->m_oldPtr;
		
		m_pose.m_aqq.serializeFloat(memPtr->m_aqq);
		memPtr->m_bframe = m_pose.m_bframe;
		memPtr->m_bvolume = m_pose.m_bvolume;
		m_pose.m_com.serializeFloat(memPtr->m_com);
		
		memPtr->m_numPositions = m_pose.m_pos.size();
		memPtr->m_positions = memPtr->m_numPositions ? (btVector3FloatData*)serializer->getUniquePointer((void*)&m_pose.m_pos[0]): 0;
		if (memPtr->m_numPositions)
		{
			int numElem = memPtr->m_numPositions;
			int sz = sizeof(btVector3Data);
			btChunk* chunk = serializer->allocate(sz,numElem);
			btVector3FloatData* memPtr = (btVector3FloatData*)chunk->m_oldPtr;
			for (int i=0;i<numElem;i++,memPtr++)
			{
				m_pose.m_pos[i].serializeFloat(*memPtr);
			}
			serializer->finalizeChunk(chunk,"btVector3FloatData",BT_ARRAY_CODE,(void*)&m_pose.m_pos[0]);
		}
		memPtr->m_restVolume = m_pose.m_volume;
		m_pose.m_rot.serializeFloat(memPtr->m_rot);
		m_pose.m_scl.serializeFloat(memPtr->m_scale);

		memPtr->m_numWeigts = m_pose.m_wgh.size();
		memPtr->m_weights = memPtr->m_numWeigts? (float*) serializer->getUniquePointer((void*) &m_pose.m_wgh[0]) : 0;
		if (memPtr->m_numWeigts)
		{
			
			int numElem = memPtr->m_numWeigts;
			int sz = sizeof(float);
			btChunk* chunk = serializer->allocate(sz,numElem);
			float* memPtr = (float*) chunk->m_oldPtr;
			for (int i=0;i<numElem;i++,memPtr++)
			{
				*memPtr = m_pose.m_wgh[i];
			}
			serializer->finalizeChunk(chunk,"float",BT_ARRAY_CODE,(void*)&m_pose.m_wgh[0]);
		}

		serializer->finalizeChunk(chunk,"SoftBodyPoseData",BT_ARRAY_CODE,(void*)&m_pose);
	}

	//clusters for convex-cluster collision detection

	sbd->m_numClusters = m_clusters.size();
	sbd->m_clusters = sbd->m_numClusters? (SoftBodyClusterData*) serializer->getUniquePointer((void*)m_clusters[0]) : 0;
	if (sbd->m_numClusters)
	{
		int numElem = sbd->m_numClusters;
		int sz = sizeof(SoftBodyClusterData);
		btChunk* chunk = serializer->allocate(sz,numElem);
		SoftBodyClusterData* memPtr = (SoftBodyClusterData*) chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			memPtr->m_adamping= m_clusters[i]->m_adamping;
			m_clusters[i]->m_av.serializeFloat(memPtr->m_av);
			memPtr->m_clusterIndex = m_clusters[i]->m_clusterIndex;
			memPtr->m_collide = m_clusters[i]->m_collide;
			m_clusters[i]->m_com.serializeFloat(memPtr->m_com);
			memPtr->m_containsAnchor = m_clusters[i]->m_containsAnchor;
			m_clusters[i]->m_dimpulses[0].serializeFloat(memPtr->m_dimpulses[0]);
			m_clusters[i]->m_dimpulses[1].serializeFloat(memPtr->m_dimpulses[1]);
			m_clusters[i]->m_framexform.serializeFloat(memPtr->m_framexform);
			memPtr->m_idmass = m_clusters[i]->m_idmass;
			memPtr->m_imass = m_clusters[i]->m_imass;
			m_clusters[i]->m_invwi.serializeFloat(memPtr->m_invwi);
			memPtr->m_ldamping = m_clusters[i]->m_ldamping;
			m_clusters[i]->m_locii.serializeFloat(memPtr->m_locii);
			m_clusters[i]->m_lv.serializeFloat(memPtr->m_lv);
			memPtr->m_matching = m_clusters[i]->m_matching;
			memPtr->m_maxSelfCollisionImpulse = m_clusters[i]->m_maxSelfCollisionImpulse;
			memPtr->m_ndamping = m_clusters[i]->m_ndamping;
			memPtr->m_ldamping = m_clusters[i]->m_ldamping;
			memPtr->m_adamping = m_clusters[i]->m_adamping;
			memPtr->m_selfCollisionImpulseFactor = m_clusters[i]->m_selfCollisionImpulseFactor;

			memPtr->m_numFrameRefs = m_clusters[i]->m_framerefs.size();
			memPtr->m_numMasses = m_clusters[i]->m_masses.size();
			memPtr->m_numNodes = m_clusters[i]->m_nodes.size();

			memPtr->m_nvimpulses = m_clusters[i]->m_nvimpulses;
			m_clusters[i]->m_vimpulses[0].serializeFloat(memPtr->m_vimpulses[0]);
			m_clusters[i]->m_vimpulses[1].serializeFloat(memPtr->m_vimpulses[1]);
			memPtr->m_ndimpulses = m_clusters[i]->m_ndimpulses;

			

			memPtr->m_framerefs = memPtr->m_numFrameRefs? (btVector3FloatData*)serializer->getUniquePointer((void*)&m_clusters[i]->m_framerefs[0]) : 0;
			if (memPtr->m_framerefs)
			{
				int numElem = memPtr->m_numFrameRefs;
				int sz = sizeof(btVector3FloatData);
				btChunk* chunk = serializer->allocate(sz,numElem);
				btVector3FloatData* memPtr = (btVector3FloatData*) chunk->m_oldPtr;
				for (int j=0;j<numElem;j++,memPtr++)
				{
					m_clusters[i]->m_framerefs[j].serializeFloat(*memPtr);
				}
				serializer->finalizeChunk(chunk,"btVector3FloatData",BT_ARRAY_CODE,(void*)&m_clusters[i]->m_framerefs[0]);
			}
			
			memPtr->m_masses = memPtr->m_numMasses ? (float*) serializer->getUniquePointer((void*)&m_clusters[i]->m_masses[0]): 0;
			if (memPtr->m_masses)
			{
				int numElem = memPtr->m_numMasses;
				int sz = sizeof(float);
				btChunk* chunk = serializer->allocate(sz,numElem);
				float* memPtr = (float*) chunk->m_oldPtr;
				for (int j=0;j<numElem;j++,memPtr++)
				{
					*memPtr = m_clusters[i]->m_masses[j];
				}
				serializer->finalizeChunk(chunk,"float",BT_ARRAY_CODE,(void*)&m_clusters[i]->m_masses[0]);
			}

			memPtr->m_nodeIndices  = memPtr->m_numNodes ? (int*) serializer->getUniquePointer((void*) &m_clusters[i]->m_nodes) : 0;
			if (memPtr->m_nodeIndices )
			{
				int numElem = memPtr->m_numMasses;
				int sz = sizeof(int);
				btChunk* chunk = serializer->allocate(sz,numElem);
				int* memPtr = (int*) chunk->m_oldPtr;
				for (int j=0;j<numElem;j++,memPtr++)
				{
					int* indexPtr = m_nodeIndexMap.find(m_clusters[i]->m_nodes[j]);
					btAssert(indexPtr);
					*memPtr = *indexPtr;
				}
				serializer->finalizeChunk(chunk,"int",BT_ARRAY_CODE,(void*)&m_clusters[i]->m_nodes);
			}
		}
		serializer->finalizeChunk(chunk,"SoftBodyClusterData",BT_ARRAY_CODE,(void*)m_clusters[0]);

	}
	

	
	sbd->m_numJoints = m_joints.size();
	sbd->m_joints = m_joints.size()? (btSoftBodyJointData*) serializer->getUniquePointer((void*)&m_joints[0]) : 0;

	if (sbd->m_joints)
	{
		int sz = sizeof(btSoftBodyJointData);
		int numElem = m_joints.size();
		btChunk* chunk = serializer->allocate(sz,numElem);
		btSoftBodyJointData* memPtr = (btSoftBodyJointData*)chunk->m_oldPtr;

		for (int i=0;i<numElem;i++,memPtr++)
		{
			memPtr->m_jointType = (int)m_joints[i]->Type();
			m_joints[i]->m_refs[0].serializeFloat(memPtr->m_refs[0]);
			m_joints[i]->m_refs[1].serializeFloat(memPtr->m_refs[1]);
			memPtr->m_cfm = m_joints[i]->m_cfm;
			memPtr->m_erp = float(m_joints[i]->m_erp);
			memPtr->m_split = float(m_joints[i]->m_split);
			memPtr->m_delete = m_joints[i]->m_delete;
			
			for (int j=0;j<4;j++)
			{
				memPtr->m_relPosition[0].m_floats[j] = 0.f;
				memPtr->m_relPosition[1].m_floats[j] = 0.f;
			}
			memPtr->m_bodyA = 0;
			memPtr->m_bodyB = 0;
			if (m_joints[i]->m_bodies[0].m_soft)
			{
				memPtr->m_bodyAtype = BT_JOINT_SOFT_BODY_CLUSTER;
				memPtr->m_bodyA = serializer->getUniquePointer((void*)m_joints[i]->m_bodies[0].m_soft);
			}
			if (m_joints[i]->m_bodies[0].m_collisionObject)
			{
				memPtr->m_bodyAtype = BT_JOINT_COLLISION_OBJECT;
				memPtr->m_bodyA = serializer->getUniquePointer((void*)m_joints[i]->m_bodies[0].m_collisionObject);
			}
			if (m_joints[i]->m_bodies[0].m_rigid)
			{
				memPtr->m_bodyAtype = BT_JOINT_RIGID_BODY;
				memPtr->m_bodyA = serializer->getUniquePointer((void*)m_joints[i]->m_bodies[0].m_rigid);
			}

			if (m_joints[i]->m_bodies[1].m_soft)
			{
				memPtr->m_bodyBtype = BT_JOINT_SOFT_BODY_CLUSTER;
				memPtr->m_bodyB = serializer->getUniquePointer((void*)m_joints[i]->m_bodies[1].m_soft);
			}
			if (m_joints[i]->m_bodies[1].m_collisionObject)
			{
				memPtr->m_bodyBtype = BT_JOINT_COLLISION_OBJECT;
				memPtr->m_bodyB = serializer->getUniquePointer((void*)m_joints[i]->m_bodies[1].m_collisionObject);
			}
			if (m_joints[i]->m_bodies[1].m_rigid)
			{
				memPtr->m_bodyBtype = BT_JOINT_RIGID_BODY;
				memPtr->m_bodyB = serializer->getUniquePointer((void*)m_joints[i]->m_bodies[1].m_rigid);
			}
		}
		serializer->finalizeChunk(chunk,"btSoftBodyJointData",BT_ARRAY_CODE,(void*) &m_joints[0]);
	}


	return btSoftBodyDataName;
}